

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForArrayLength
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  DefUseManager *pDVar2;
  mapped_type *this_00;
  uint32_t local_40;
  uint32_t local_3c;
  Instruction *pIStack_38;
  uint32_t type_id;
  Instruction *pointer_type_inst;
  Instruction *pIStack_28;
  uint32_t pointer_type_id;
  Instruction *object_inst;
  Instruction *pIStack_18;
  uint32_t object_id;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  pIStack_18 = inst;
  inst_local = (Instruction *)this;
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 == OpArrayLength) {
    object_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIStack_18,0);
    pDVar2 = Pass::get_def_use_mgr((Pass *)this);
    pIStack_28 = analysis::DefUseManager::GetDef(pDVar2,object_inst._4_4_);
    pointer_type_inst._4_4_ = opt::Instruction::type_id(pIStack_28);
    pDVar2 = Pass::get_def_use_mgr((Pass *)this);
    pIStack_38 = analysis::DefUseManager::GetDef(pDVar2,pointer_type_inst._4_4_);
    local_3c = opt::Instruction::GetSingleWordInOperand(pIStack_38,1);
    this_00 = std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->used_members_,&local_3c);
    local_40 = opt::Instruction::GetSingleWordInOperand(pIStack_18,1);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (this_00,&local_40);
    return;
  }
  __assert_fail("inst->opcode() == spv::Op::OpArrayLength",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x115,
                "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForArrayLength(const Instruction *)"
               );
}

Assistant:

void EliminateDeadMembersPass::MarkMembersAsLiveForArrayLength(
    const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpArrayLength);
  uint32_t object_id = inst->GetSingleWordInOperand(0);
  Instruction* object_inst = get_def_use_mgr()->GetDef(object_id);
  uint32_t pointer_type_id = object_inst->type_id();
  Instruction* pointer_type_inst = get_def_use_mgr()->GetDef(pointer_type_id);
  uint32_t type_id = pointer_type_inst->GetSingleWordInOperand(1);
  used_members_[type_id].insert(inst->GetSingleWordInOperand(1));
}